

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::decide_to_pick_anti_particles(particleSamples *this,int monval)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  int strange;
  int baryon;
  int charge;
  int pick_flag;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_10;
  
  iVar1 = (int)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RDI + 0x610) == 0x270e) {
    iVar1 = particle_decay::get_particle_charge
                      ((particle_decay *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar1);
    bVar2 = iVar1 < 0;
  }
  else if (*(int *)(in_RDI + 0x610) == 0x270d) {
    iVar1 = particle_decay::get_particle_baryon_number
                      ((particle_decay *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar1);
    bVar2 = iVar1 < 0;
  }
  else if (*(int *)(in_RDI + 0x610) == 0x270c) {
    iVar1 = particle_decay::get_particle_strange_number
                      ((particle_decay *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar1);
    bVar2 = 0 < iVar1;
  }
  else {
    bVar2 = *(int *)(in_RDI + 0x610) == -in_ESI;
  }
  local_10 = (uint)bVar2;
  return local_10;
}

Assistant:

int particleSamples::decide_to_pick_anti_particles(int monval) {
    // this function judge whether particle is the anti-particle of the
    // particle of interest
    int pick_flag = 0;
    if (particle_monval == 9998) {
        // anti-particles for all positive charged hadrons
        // pick all negative charged hadrons
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge < 0) {
            pick_flag = 1;
        }
    } else if (particle_monval == 9997) {
        // anti-particles for all baryons:
        // pick all anti-baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon < 0) {
            pick_flag = 1;
        }
    } else if (particle_monval == 9996) {
        // anti-particles for all strangness particles:
        // pick all anti-strangness particles
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange > 0) {
            pick_flag = 1;
        }
    } else {
        // for identified particle: pick its anti-particle
        if (particle_monval == -monval) {
            pick_flag = 1;
        }
    }
    return (pick_flag);
}